

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_2dcf93::Db::parseBinaryExpr(Db *this,StringView Kind)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar1 = parseExpr(this);
  if ((pNVar1 != (Node *)0x0) && (pNVar2 = parseExpr(this), pNVar2 != (Node *)0x0)) {
    pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x30);
    pNVar3->K = KExpr;
    pNVar3->RHSComponentCache = No;
    pNVar3->ArrayCache = No;
    pNVar3->FunctionCache = No;
    pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001cfb10;
    pNVar3[1]._vptr_Node = (_func_int **)pNVar1;
    *(char **)&pNVar3[1].K = Kind.First;
    pNVar3[2]._vptr_Node = (_func_int **)Kind.Last;
    *(Node **)&pNVar3[2].K = pNVar2;
    return pNVar3;
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseBinaryExpr(StringView Kind) {
  Node *LHS = parseExpr();
  if (LHS == nullptr)
    return nullptr;
  Node *RHS = parseExpr();
  if (RHS == nullptr)
    return nullptr;
  return make<BinaryExpr>(LHS, Kind, RHS);
}